

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

StringCopyInfo * __thiscall
Memory::AllocateArray<Memory::ArenaAllocator,Js::StringCopyInfo,false>
          (Memory *this,ArenaAllocator *allocator,AllocFuncType AllocFunc,size_t count)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  StringCopyInfo *pSVar16;
  bool *pbVar17;
  ulong uVar18;
  size_t byteSize;
  undefined1 auVar19 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar20 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar21 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar22 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar23 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar24 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar25 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar26 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  long lVar30;
  undefined1 auVar31 [16];
  long lVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 in_XMM14 [16];
  undefined1 auVar41 [16];
  
  if (count == 0) {
    pSVar16 = (StringCopyInfo *)0x8;
  }
  else {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = count;
    byteSize = 0xffffffffffffffff;
    if (SUB168(auVar2 * ZEXT816(0x18),8) == 0) {
      byteSize = SUB168(auVar2 * ZEXT816(0x18),0);
    }
    pSVar16 = (StringCopyInfo *)
              new__<Memory::ArenaAllocator>
                        (byteSize,(ArenaAllocator *)this,(offset_in_ArenaAllocator_to_subr)allocator
                        );
    auVar2 = _DAT_00e0c4f0;
    uVar18 = 0;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = count * 0x18 - 0x18;
    auVar1 = auVar1 / ZEXT816(0x18);
    auVar19._8_4_ = auVar1._0_4_;
    auVar19._0_8_ = auVar1._0_8_;
    auVar19._12_4_ = auVar1._4_4_;
    pbVar17 = &pSVar16->isInitialized;
    auVar20 = pmovsxbq(in_XMM1,0xf0e);
    auVar21 = pmovsxbq(in_XMM2,0xd0c);
    auVar22 = pmovsxbq(in_XMM3,0xb0a);
    auVar23 = pmovsxbq(in_XMM4,0x908);
    auVar24 = pmovsxbq(in_XMM5,0x706);
    auVar25 = pmovsxbq(in_XMM6,0x504);
    auVar26 = pmovsxbq(in_XMM7,0x302);
    auVar27 = pmovsxbq(in_XMM8,0x100);
    do {
      auVar28._8_4_ = (int)uVar18;
      auVar28._0_8_ = uVar18;
      auVar28._12_4_ = (int)(uVar18 >> 0x20);
      auVar31 = auVar19 ^ auVar2;
      auVar33 = (auVar28 | auVar27) ^ auVar2;
      lVar30 = auVar31._0_8_;
      auVar34._0_8_ = -(ulong)(lVar30 < auVar33._0_8_);
      lVar32 = auVar31._8_8_;
      auVar34._8_8_ = -(ulong)(lVar32 < auVar33._8_8_);
      auVar41 = pshuflw(in_XMM14,auVar34,0xe8);
      auVar33._8_4_ = 0xffffffff;
      auVar33._0_8_ = 0xffffffffffffffff;
      auVar33._12_4_ = 0xffffffff;
      auVar33 = packssdw(auVar41 ^ auVar33,auVar41 ^ auVar33);
      if ((auVar33 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *pbVar17 = false;
      }
      auVar34 = packssdw(auVar34,auVar34);
      auVar41._8_4_ = 0xffffffff;
      auVar41._0_8_ = 0xffffffffffffffff;
      auVar41._12_4_ = 0xffffffff;
      auVar34 = packssdw(auVar34 ^ auVar41,auVar34 ^ auVar41);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34 & (undefined1  [16])0x100) != (undefined1  [16])0x0) {
        pbVar17[0x18] = false;
      }
      auVar34 = (auVar28 | auVar26) ^ auVar2;
      auVar35._0_8_ = -(ulong)(lVar30 < auVar34._0_8_);
      auVar35._8_8_ = -(ulong)(lVar32 < auVar34._8_8_);
      auVar33 = packssdw(auVar33,auVar35);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar33 = packssdw(auVar33 ^ auVar3,auVar33 ^ auVar3);
      auVar33 = packsswb(auVar33,auVar33);
      if ((auVar33 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        pbVar17[0x30] = false;
      }
      auVar34 = pshufhw(auVar35,auVar35,0x84);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar34 = packssdw(auVar34 ^ auVar4,auVar34 ^ auVar4);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34 & (undefined1  [16])0x1000000) != (undefined1  [16])0x0) {
        pbVar17[0x48] = false;
      }
      auVar34 = (auVar28 | auVar25) ^ auVar2;
      auVar36._0_8_ = -(ulong)(lVar30 < auVar34._0_8_);
      auVar36._8_8_ = -(ulong)(lVar32 < auVar34._8_8_);
      auVar33 = pshuflw(auVar33,auVar36,0xe8);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar33 = packssdw(auVar33 ^ auVar5,auVar33 ^ auVar5);
      auVar33 = packsswb(auVar33,auVar33);
      if ((auVar33 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        pbVar17[0x60] = false;
      }
      auVar34 = packssdw(auVar36,auVar36);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar34 = packssdw(auVar34 ^ auVar6,auVar34 ^ auVar6);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34 & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0) {
        pbVar17[0x78] = false;
      }
      auVar34 = (auVar28 | auVar24) ^ auVar2;
      auVar37._0_8_ = -(ulong)(lVar30 < auVar34._0_8_);
      auVar37._8_8_ = -(ulong)(lVar32 < auVar34._8_8_);
      auVar33 = packssdw(auVar33,auVar37);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar33 = packssdw(auVar33 ^ auVar7,auVar33 ^ auVar7);
      auVar33 = packsswb(auVar33,auVar33);
      if ((auVar33 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        pbVar17[0x90] = false;
      }
      auVar34 = pshufhw(auVar37,auVar37,0x84);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar34 = packssdw(auVar34 ^ auVar8,auVar34 ^ auVar8);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34 & (undefined1  [16])0x100000000000000) != (undefined1  [16])0x0) {
        pbVar17[0xa8] = false;
      }
      auVar34 = (auVar28 | auVar23) ^ auVar2;
      auVar38._0_8_ = -(ulong)(lVar30 < auVar34._0_8_);
      auVar38._8_8_ = -(ulong)(lVar32 < auVar34._8_8_);
      auVar33 = pshuflw(auVar33,auVar38,0xe8);
      auVar9._8_4_ = 0xffffffff;
      auVar9._0_8_ = 0xffffffffffffffff;
      auVar9._12_4_ = 0xffffffff;
      auVar33 = packssdw(auVar33 ^ auVar9,auVar33 ^ auVar9);
      auVar33 = packsswb(auVar33,auVar33);
      if ((auVar33 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pbVar17[0xc0] = false;
      }
      auVar34 = packssdw(auVar38,auVar38);
      auVar10._8_4_ = 0xffffffff;
      auVar10._0_8_ = 0xffffffffffffffff;
      auVar10._12_4_ = 0xffffffff;
      auVar34 = packssdw(auVar34 ^ auVar10,auVar34 ^ auVar10);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34 & (undefined1  [16])0x100) != (undefined1  [16])0x0) {
        pbVar17[0xd8] = false;
      }
      auVar34 = (auVar28 | auVar22) ^ auVar2;
      auVar39._0_8_ = -(ulong)(lVar30 < auVar34._0_8_);
      auVar39._8_8_ = -(ulong)(lVar32 < auVar34._8_8_);
      auVar33 = packssdw(auVar33,auVar39);
      auVar11._8_4_ = 0xffffffff;
      auVar11._0_8_ = 0xffffffffffffffff;
      auVar11._12_4_ = 0xffffffff;
      auVar33 = packssdw(auVar33 ^ auVar11,auVar33 ^ auVar11);
      auVar33 = packsswb(auVar33,auVar33);
      if ((auVar33 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        pbVar17[0xf0] = false;
      }
      auVar34 = pshufhw(auVar39,auVar39,0x84);
      auVar12._8_4_ = 0xffffffff;
      auVar12._0_8_ = 0xffffffffffffffff;
      auVar12._12_4_ = 0xffffffff;
      auVar34 = packssdw(auVar34 ^ auVar12,auVar34 ^ auVar12);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34 & (undefined1  [16])0x1000000) != (undefined1  [16])0x0) {
        pbVar17[0x108] = false;
      }
      auVar34 = (auVar28 | auVar21) ^ auVar2;
      auVar40._0_8_ = -(ulong)(lVar30 < auVar34._0_8_);
      auVar40._8_8_ = -(ulong)(lVar32 < auVar34._8_8_);
      auVar33 = pshuflw(auVar33,auVar40,0xe8);
      auVar13._8_4_ = 0xffffffff;
      auVar13._0_8_ = 0xffffffffffffffff;
      auVar13._12_4_ = 0xffffffff;
      auVar33 = packssdw(auVar33 ^ auVar13,auVar33 ^ auVar13);
      in_XMM14 = packsswb(auVar33,auVar33);
      if ((in_XMM14 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        pbVar17[0x120] = false;
      }
      auVar33 = packssdw(auVar40,auVar40);
      auVar14._8_4_ = 0xffffffff;
      auVar14._0_8_ = 0xffffffffffffffff;
      auVar14._12_4_ = 0xffffffff;
      auVar33 = packssdw(auVar33 ^ auVar14,auVar33 ^ auVar14);
      auVar33 = packsswb(auVar33,auVar33);
      if ((auVar33 & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0) {
        pbVar17[0x138] = false;
      }
      auVar33 = (auVar28 | auVar20) ^ auVar2;
      auVar29._0_8_ = -(ulong)(lVar30 < auVar33._0_8_);
      auVar29._8_8_ = -(ulong)(lVar32 < auVar33._8_8_);
      auVar33 = packssdw(auVar31,auVar29);
      auVar31._8_4_ = 0xffffffff;
      auVar31._0_8_ = 0xffffffffffffffff;
      auVar31._12_4_ = 0xffffffff;
      auVar33 = packssdw(auVar33 ^ auVar31,auVar33 ^ auVar31);
      auVar33 = packsswb(auVar33,auVar33);
      if ((auVar33 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        pbVar17[0x150] = false;
      }
      auVar33 = pshufhw(auVar29,auVar29,0x84);
      auVar15._8_4_ = 0xffffffff;
      auVar15._0_8_ = 0xffffffffffffffff;
      auVar15._12_4_ = 0xffffffff;
      auVar33 = packssdw(auVar33 ^ auVar15,auVar33 ^ auVar15);
      auVar33 = packsswb(auVar33,auVar33);
      if ((auVar33 & (undefined1  [16])0x100000000000000) != (undefined1  [16])0x0) {
        pbVar17[0x168] = false;
      }
      uVar18 = uVar18 + 0x10;
      pbVar17 = pbVar17 + 0x180;
    } while ((auVar1._0_8_ + 0x10U & 0x1ffffffffffffff0) != uVar18);
  }
  return pSVar16;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}